

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_func_t * wasm_func_new(wasm_store_t *store,wasm_functype_t *type,wasm_func_callback_t callback)

{
  FuncType *pFVar1;
  wasm_func_t *this;
  Callback local_140;
  FuncType local_120;
  Ptr local_e0;
  RefPtr<wabt::interp::Func> local_c8;
  undefined1 local_b0 [8];
  anon_class_80_3_e2e6609b lambda;
  FuncType wabt_type;
  wasm_func_callback_t callback_local;
  wasm_functype_t *type_local;
  wasm_store_t *store_local;
  
  pFVar1 = wasm_externtype_t::As<wabt::interp::FuncType>(&type->super_wasm_externtype_t);
  wabt::interp::FuncType::FuncType((FuncType *)&lambda.callback,pFVar1);
  local_b0 = (undefined1  [8])store;
  wabt::interp::FuncType::FuncType((FuncType *)&lambda,(FuncType *)&lambda.callback);
  lambda.wabt_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)callback;
  this = (wasm_func_t *)operator_new(0x18);
  wabt::interp::FuncType::FuncType(&local_120,(FuncType *)&lambda.callback);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<wasm_func_new::__0&,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_140,(anon_class_80_3_e2e6609b *)local_b0);
  wabt::interp::HostFunc::New(&local_e0,&store->I,&local_120,&local_140);
  wabt::interp::RefPtr<wabt::interp::Func>::RefPtr<wabt::interp::HostFunc>(&local_c8,&local_e0);
  wasm_func_t::wasm_func_t(this,&local_c8);
  wabt::interp::RefPtr<wabt::interp::Func>::~RefPtr(&local_c8);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr(&local_e0);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_140);
  wabt::interp::FuncType::~FuncType(&local_120);
  wasm_func_new::$_0::~__0((__0 *)local_b0);
  wabt::interp::FuncType::~FuncType((FuncType *)&lambda.callback);
  return this;
}

Assistant:

own wasm_func_t* wasm_func_new(wasm_store_t* store,
                               const wasm_functype_t* type,
                               wasm_func_callback_t callback) {
  FuncType wabt_type = *type->As<FuncType>();
  auto lambda = [=](Thread& thread, const Values& wabt_params,
                    Values& wabt_results, Trap::Ptr* out_trap) -> Result {
    wasm_val_vec_t params, results;
    wasm_val_vec_new_uninitialized(&params, wabt_params.size());
    wasm_val_vec_new_uninitialized(&results, wabt_results.size());
    FromWabtValues(store->I, &params, wabt_type.params, wabt_params);
    auto trap = callback(&params, &results);
    wasm_val_vec_delete(&params);
    if (trap) {
      *out_trap = trap->I.As<Trap>();
      wasm_trap_delete(trap);
      // Can't use wasm_val_vec_delete since it wasn't populated.
      delete[] results.data;
      return Result::Error;
    }
    wabt_results = ToWabtValues(&results);
    wasm_val_vec_delete(&results);
    return Result::Ok;
  };

  return new wasm_func_t{HostFunc::New(store->I, wabt_type, lambda)};
}